

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O2

void vkt::api::anon_unknown_1::renderReferenceTriangle(PixelBufferAccess *dst,Vec4 (*vertices) [3])

{
  Renderer renderer;
  Program program;
  DrawCommand local_318;
  VertexAttrib local_2e8;
  RefFragmentShader fragShader;
  MultisamplePixelBufferAccess colorBuffer;
  RefVertexShader vertShader;
  PrimitiveList local_228;
  RenderState renderState;
  RenderTarget renderTarget;
  
  rr::VertexShader::VertexShader(&vertShader.super_VertexShader,1,0);
  vertShader.super_VertexShader._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00bc7e60;
  (vertShader.super_VertexShader.m_inputs.
   super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  rr::FragmentShader::FragmentShader(&fragShader.super_FragmentShader,0,1);
  fragShader.super_FragmentShader._vptr_FragmentShader = (_func_int **)&PTR_shadeFragments_00bc7e90;
  (fragShader.super_FragmentShader.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  program.geometryShader = (GeometryShader *)0x0;
  program.vertexShader = &vertShader.super_VertexShader;
  program.fragmentShader = &fragShader.super_FragmentShader;
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(&colorBuffer,dst);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&renderState);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_318);
  rr::RenderTarget::RenderTarget
            (&renderTarget,&colorBuffer,(MultisamplePixelBufferAccess *)&renderState,
             (MultisamplePixelBufferAccess *)&local_318);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&local_318,&colorBuffer);
  local_2e8.type = VERTEXATTRIBTYPE_FLOAT;
  local_2e8.size = 0;
  local_2e8.instanceDivisor = (int)local_318.program;
  local_2e8.stride = local_318.renderTarget._4_4_;
  local_2e8.pointer = (void *)0x3f80000000000000;
  rr::RenderState::RenderState
            (&renderState,(ViewportState *)&local_2e8,VIEWPORTORIENTATION_UPPER_LEFT);
  rr::Renderer::Renderer(&renderer);
  local_2e8.type = VERTEXATTRIBTYPE_FLOAT;
  local_2e8.size = 4;
  local_2e8.stride = 0x10;
  local_2e8.instanceDivisor = 0;
  local_2e8.generic.v._0_8_ = 0;
  local_2e8.generic.v._8_8_ = 0;
  local_2e8.pointer = vertices;
  rr::PrimitiveList::PrimitiveList(&local_228,PRIMITIVETYPE_TRIANGLES,3,0);
  local_318.program = &program;
  local_318.numVertexAttribs = 1;
  local_318.state = &renderState;
  local_318.renderTarget = &renderTarget;
  local_318.vertexAttribs = &local_2e8;
  local_318.primitives = &local_228;
  rr::Renderer::draw(&renderer,&local_318);
  rr::Renderer::~Renderer(&renderer);
  rr::FragmentShader::~FragmentShader(&fragShader.super_FragmentShader);
  rr::VertexShader::~VertexShader(&vertShader.super_VertexShader);
  return;
}

Assistant:

void renderReferenceTriangle (const tcu::PixelBufferAccess& dst, const tcu::Vec4 (&vertices)[3])
{
	const RefVertexShader					vertShader;
	const RefFragmentShader					fragShader;
	const rr::Program						program			(&vertShader, &fragShader);
	const rr::MultisamplePixelBufferAccess	colorBuffer		= rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(dst);
	const rr::RenderTarget					renderTarget	(colorBuffer);
	const rr::RenderState					renderState		((rr::ViewportState(colorBuffer)), rr::VIEWPORTORIENTATION_UPPER_LEFT);
	const rr::Renderer						renderer;
	const rr::VertexAttrib					vertexAttribs[]	=
	{
		rr::VertexAttrib(rr::VERTEXATTRIBTYPE_FLOAT, 4, sizeof(tcu::Vec4), 0, vertices[0].getPtr())
	};

	renderer.draw(rr::DrawCommand(renderState,
								  renderTarget,
								  program,
								  DE_LENGTH_OF_ARRAY(vertexAttribs),
								  &vertexAttribs[0],
								  rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, DE_LENGTH_OF_ARRAY(vertices), 0)));
}